

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O1

void ipc_dialer_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  nng_stream *s;
  nni_mtx *mtx;
  
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    s = (nng_stream *)nni_aio_get_prov_data(aio);
    if (s != (nng_stream *)0x0) {
      nni_aio_list_remove(aio);
      s[3].s_get = (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0;
      nni_aio_set_prov_data(aio,(void *)0x0);
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio,rv);
      nng_stream_stop(s);
      nng_stream_free(s);
      return;
    }
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ipc_dialer_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_ipc_dialer *d = arg;
	nni_ipc_conn   *c;

	nni_mtx_lock(&d->mtx);
	if ((!nni_aio_list_active(aio)) ||
	    ((c = nni_aio_get_prov_data(aio)) == NULL)) {
		nni_mtx_unlock(&d->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);

	nni_aio_finish_error(aio, rv);
	nng_stream_stop(&c->stream);
	nng_stream_free(&c->stream);
}